

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::append(QString *this,QUtf8StringView str)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *self;
  
  self = *(QString **)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::append_helper<QBasicUtf8StringView<false>>(self,str);
  if (*(QString **)(in_FS_OFFSET + 0x28) == self) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::append(QUtf8StringView str)
{
    append_helper(*this, str);
    return *this;
}